

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

long lodepng_filesize(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *local_28;
  long size;
  FILE *file;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0xffffffffffffffff;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      local_28 = (char *)ftell(__stream);
      if (local_28 == (char *)0x7fffffffffffffff) {
        local_28 = (char *)0xffffffffffffffff;
      }
      fclose(__stream);
      filename_local = local_28;
    }
    else {
      fclose(__stream);
      filename_local = (char *)0xffffffffffffffff;
    }
  }
  return (long)filename_local;
}

Assistant:

static long lodepng_filesize(const char* filename)
{
  FILE* file;
  long size;
  file = fopen(filename, "rb");
  if(!file) return -1;

  if(fseek(file, 0, SEEK_END) != 0)
  {
    fclose(file);
    return -1;
  }

  size = ftell(file);
  /* It may give LONG_MAX as directory size, this is invalid for us. */
  if(size == LONG_MAX) size = -1;

  fclose(file);
  return size;
}